

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

UBool icu_63::UCharsTrie::findUniqueValue(UChar *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  bool bVar1;
  UChar *pos_00;
  uint uVar2;
  uint uVar3;
  UBool unaff_BPL;
  uint uVar4;
  bool bVar5;
  
LAB_002af8f1:
  do {
    uVar2 = (uint)(ushort)*pos;
    pos_00 = pos + 1;
    uVar3 = *uniqueValue;
    while (0x2f < uVar2) {
      if (uVar2 < 0x40) {
        pos = pos_00 + (uVar2 - 0x2f);
        goto LAB_002af8f1;
      }
      if ((uVar2 & 0x7f8000) == 0) {
        if (uVar2 < 0x4040) {
          uVar4 = (uVar2 >> 6) - 1;
        }
        else {
          if (0x7fbf < uVar2) goto LAB_002af971;
          uVar4 = (uVar2 & 0x7fc0) * 0x400 + (uint)(ushort)*pos_00 + 0xfeff0000;
        }
      }
      else {
        uVar4 = uVar2 & 0x7fff;
        if (0x3fff < uVar4) {
          if (uVar4 == 0x7fff) {
LAB_002af971:
            uVar4 = CONCAT22(*pos_00,pos_00[1]);
          }
          else {
            uVar4 = uVar4 * 0x10000 + (uint)(ushort)*pos_00 + 0xc0000000;
          }
        }
      }
      if (haveUniqueValue == '\0') {
        *uniqueValue = uVar4;
        haveUniqueValue = '\x01';
LAB_002af997:
        uVar3 = uVar4;
        if ((uVar2 & 0x7f8000) == 0) {
          if (0x403f < uVar2) {
            if (uVar2 < 0x7fc0) {
              pos_00 = pos_00 + 1;
            }
            else {
              pos_00 = pos_00 + 2;
            }
          }
          uVar2 = uVar2 & 0x3f;
          bVar1 = true;
        }
        else {
          unaff_BPL = '\x01';
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
        bVar5 = uVar4 == uVar3;
        uVar4 = uVar3;
        if (bVar5) goto LAB_002af997;
        unaff_BPL = '\0';
      }
      if (!bVar1) {
        return unaff_BPL;
      }
    }
    if (uVar2 == 0) {
      uVar2 = (uint)(ushort)*pos_00;
      pos_00 = pos_00 + 1;
    }
    pos = findUniqueValueFromBranch(pos_00,uVar2 + 1,haveUniqueValue,uniqueValue);
    haveUniqueValue = '\x01';
    if (pos == (UChar *)0x0) {
      return '\0';
    }
  } while( true );
}

Assistant:

UBool
UCharsTrie::findUniqueValue(const UChar *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
            node=*pos++;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match units.
            node=*pos++;
        } else {
            UBool isFinal=(UBool)(node>>15);
            int32_t value;
            if(isFinal) {
                value=readValue(pos, node&0x7fff);
            } else {
                value=readNodeValue(pos, node);
            }
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
}